

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::
token_matcher<pstore::exchange::import_ns::callbacks,_pstore::json::details::null_complete>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
           *__return_storage_ptr__,
          token_matcher<pstore::exchange::import_ns::callbacks,_pstore::json::details::null_complete>
          *this,parser<pstore::exchange::import_ns::callbacks> *parser,maybe<char,_void> *ch)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  *puVar6;
  char *pcVar7;
  error_category *peVar8;
  error_category *extraout_RDX;
  bool bVar9;
  error_code err;
  error_code err_00;
  
  iVar3 = (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_;
  if (iVar3 == 2) {
    if (ch->valid_ == true) {
      pcVar7 = maybe<char,_void>::operator->(ch);
      pcVar5 = this->text_;
      if (*pcVar7 == *pcVar5) {
        this->text_ = pcVar5 + 1;
        bVar1 = true;
        if (pcVar5[1] != '\0') goto LAB_0011897d;
        iVar3 = 3;
        bVar9 = true;
        goto LAB_00118979;
      }
    }
LAB_00118958:
    peVar8 = get_error_category();
    err_00._M_cat = peVar8;
    err_00._0_8_ = 0xb;
    bVar2 = parser<pstore::exchange::import_ns::callbacks>::set_error(parser,err_00);
    bVar1 = true;
    iVar3 = 1;
    bVar9 = true;
    if (!bVar2) goto LAB_0011897d;
  }
  else {
    bVar9 = true;
    bVar1 = true;
    if (iVar3 != 3) {
      if (iVar3 == 1) {
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x1ad);
      }
      goto LAB_0011897d;
    }
    if (ch->valid_ == true) {
      pcVar5 = maybe<char,_void>::operator->(ch);
      iVar3 = isalnum((int)*pcVar5);
      if (iVar3 != 0) goto LAB_00118958;
      bVar9 = false;
    }
    puVar6 = exchange::import_ns::callbacks::top(&parser->callbacks_);
    uVar4 = (*((puVar6->_M_t).
               super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
               .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl)->
              _vptr_rule[8])();
    err._4_4_ = 0;
    err._M_value = uVar4;
    err._M_cat = extraout_RDX;
    bVar1 = parser<pstore::exchange::import_ns::callbacks>::set_error(parser,err);
    iVar3 = 1;
    if (bVar1) {
      (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 1;
    }
  }
LAB_00118979:
  bVar1 = bVar9;
  (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = iVar3;
LAB_0011897d:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
       = 0;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl = (matcher<pstore::exchange::import_ns::callbacks> *)0x0;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
       = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
          )0x1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl = (matcher<pstore::exchange::import_ns::callbacks> *)0x0;
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            token_matcher<Callbacks, DoneFunction>::consume (parser<Callbacks> & parser,
                                                             maybe<char> ch) {
                bool match = true;
                switch (this->get_state ()) {
                case start_state:
                    if (!ch || *ch != *text_) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        ++text_;
                        if (*text_ == '\0') {
                            // We've run out of input text, so ensure that the next character isn't
                            // alpha-numeric.
                            this->set_state (last_state);
                        }
                    }
                    break;
                case last_state:
                    if (ch) {
                        if (std::isalnum (*ch) != 0) {
                            this->set_error (parser, error_code::unrecognized_token);
                            return {nullptr, true};
                        }
                        match = false;
                    }
                    this->set_error (parser, done_ (parser));
                    this->set_state (done_state);
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, match};
            }